

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

int qpdfjob_initialize_from_json(qpdfjob_handle j,char *json)

{
  int iVar1;
  anon_class_8_1_898d99e6 local_40;
  function<int_(_qpdfjob_handle_*)> local_38;
  char *local_18;
  char *json_local;
  qpdfjob_handle j_local;
  
  local_40.json = json;
  local_18 = json;
  json_local = (char *)j;
  std::function<int(_qpdfjob_handle*)>::function<qpdfjob_initialize_from_json::__0,void>
            ((function<int(_qpdfjob_handle*)> *)&local_38,&local_40);
  iVar1 = wrap_qpdfjob(j,&local_38);
  std::function<int_(_qpdfjob_handle_*)>::~function(&local_38);
  return iVar1;
}

Assistant:

int
qpdfjob_initialize_from_json(qpdfjob_handle j, char const* json)
{
    return wrap_qpdfjob(j, [json](qpdfjob_handle jh) {
        jh->j.setMessagePrefix("qpdfjob json");
        jh->j.initializeFromJson(json);
        return 0;
    });
}